

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O0

deRoundingMode deGetRoundingMode(void)

{
  int iVar1;
  undefined4 local_c;
  int mode;
  
  iVar1 = fegetround();
  if (iVar1 == 0) {
    local_c = DE_ROUNDINGMODE_TO_NEAREST_EVEN;
  }
  else if (iVar1 == 0x400) {
    local_c = DE_ROUNDINGMODE_TO_NEGATIVE_INF;
  }
  else if (iVar1 == 0x800) {
    local_c = DE_ROUNDINGMODE_TO_POSITIVE_INF;
  }
  else if (iVar1 == 0xc00) {
    local_c = DE_ROUNDINGMODE_TO_ZERO;
  }
  else {
    local_c = DE_ROUNDINGMODE_LAST;
  }
  return local_c;
}

Assistant:

deRoundingMode deGetRoundingMode (void)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	unsigned int status = 0;
	int ret;

	ret = _controlfp_s(&status, 0, 0);
	DE_ASSERT(ret == 0);

	switch (status & _MCW_RC)
	{
		case _RC_CHOP:	return DE_ROUNDINGMODE_TO_ZERO;
		case _RC_UP:	return DE_ROUNDINGMODE_TO_POSITIVE_INF;
		case _RC_DOWN:	return DE_ROUNDINGMODE_TO_NEGATIVE_INF;
		case _RC_NEAR:	return DE_ROUNDINGMODE_TO_NEAREST_EVEN;
		default:		return DE_ROUNDINGMODE_LAST;
	}
#elif (DE_COMPILER == DE_COMPILER_GCC) || (DE_COMPILER == DE_COMPILER_CLANG)
	int mode = fegetround();
	switch (mode)
	{
		case FE_TOWARDZERO:	return DE_ROUNDINGMODE_TO_ZERO;
		case FE_UPWARD:		return DE_ROUNDINGMODE_TO_POSITIVE_INF;
		case FE_DOWNWARD:	return DE_ROUNDINGMODE_TO_NEGATIVE_INF;
		case FE_TONEAREST:	return DE_ROUNDINGMODE_TO_NEAREST_EVEN;
		default:			return DE_ROUNDINGMODE_LAST;
	}
#else
#	error Implement deGetRoundingMode().
#endif
}